

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region,_toml::detail::none_t> * __thiscall
toml::detail::
sequence<toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<(char)9>,toml::detail::in_range<(char)32,(char)126>>,toml::detail::sequence<toml::detail::in_range<(char)-62,(char)-33>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)-32>,toml::detail::in_range<(char)-96,(char)-65>>,toml::detail::sequence<toml::detail::in_range<(char)-31,(char)-20>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::character<(char)-19>,toml::detail::in_range<(char)-128,(char)-97>>,toml::detail::sequence<toml::detail::in_range<(char)-18,(char)-17>,toml::detail::in_range<(char)-128,(char)-65>>>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)-16>,toml::detail::in_range<(char)-112,(char)-65>>,toml::detail::sequence<toml::detail::in_range<(char)-15,(char)-13>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::character<(char)-12>,toml::detail::in_range<(char)-128,(char)-113>>>,toml::detail::in_range<(char)-128,(char)-65>,toml::detail::in_range<(char)-128,(char)-65>>>,toml::detail::unlimited>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>
::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,
          sequence<toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)35>,toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<(char)9>,toml::detail::in_range<(char)32,(char)126>>,toml::detail::sequence<toml::detail::in_range<(char)_62,(char)_33>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)_32>,toml::detail::in_range<(char)_96,(char)_65>>,toml::detail::sequence<toml::detail::in_range<(char)_31,(char)_20>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::character<(char)_19>,toml::detail::in_range<(char)_128,(char)_97>>,toml::detail::sequence<toml::detail::in_range<(char)_18,(char)_17>,toml::detail::in_range<(char)_128,(char)_65>>>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)_16>,toml::detail::in_range<(char)_112,(char)_65>>,toml::detail::sequence<toml::detail::in_range<(char)_15,(char)_13>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::character<(char)_12>,toml::detail::in_range<(char)_128,(char)_113>>>,toml::detail::in_range<(char)_128,(char)_65>,toml::detail::in_range<(char)_128,(char)_65>>>,toml::detail::unlimited>>>,toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>
          *this,location *loc,region *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  bool bVar1;
  value_type *other;
  location local_e0;
  undefined4 local_98;
  failure_type local_81;
  region *local_80;
  undefined1 local_78 [8];
  result<toml::detail::region,_toml::detail::none_t> rslt;
  region *reg_local;
  location *loc_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  maybe<toml::detail::sequence<toml::detail::character<'#'>,_toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<'\t'>,_toml::detail::in_range<'_',_'~'>_>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_78,(location *)this);
  bVar1 = result<toml::detail::region,_toml::detail::none_t>::is_err
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  if (bVar1) {
    local_80 = reg;
    location::reset((location *)this,(const_iterator)reg);
    none();
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_81);
  }
  else {
    other = result<toml::detail::region,_toml::detail::none_t>::unwrap
                      ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
    region::operator+=((region *)loc,other);
    region::region((region *)&local_e0,(region *)loc);
    sequence<toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>
    ::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::either<toml::detail::character<(char)10>,toml::detail::sequence<toml::detail::character<(char)13>,toml::detail::character<(char)10>>>>
                *)this,&local_e0,reg,first);
    region::~region((region *)&local_e0);
  }
  local_98 = 1;
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc, region reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }